

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

Node * __thiscall JSON::Parser::parseArrayExpression(Node *__return_storage_ptr__,Parser *this)

{
  int start;
  Node *pNVar1;
  TokenType TVar2;
  Token *token;
  vector<JSON::Node,_std::allocator<JSON::Node>_> elements;
  Node *node;
  vector<JSON::Node,_std::allocator<JSON::Node>_> local_e8;
  Node *local_d0;
  string local_c8;
  vector<JSON::Node,_std::allocator<JSON::Node>_> local_a8;
  Node local_90;
  
  token = &this->currentToken;
  local_d0 = __return_storage_ptr__;
  if ((this->currentToken).type != BRACKETS_START) {
    unexpected(this,token);
  }
  start = (this->currentToken).start;
  next(this);
  local_e8.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TVar2 = (this->currentToken).type;
  if (TVar2 == BRACKETS_END || this->length <= this->pos) {
LAB_00105c26:
    if (TVar2 == BRACKETS_END) {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,NodeType::ArrayExpression_abi_cxx11_,
                 DAT_0010e370 + NodeType::ArrayExpression_abi_cxx11_);
      std::vector<JSON::Node,_std::allocator<JSON::Node>_>::vector(&local_a8,&local_e8);
      pNVar1 = local_d0;
      Node::Node(local_d0,&local_c8,&local_a8,start,(this->currentToken).end);
      std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector(&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      next(this);
      std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector(&local_e8);
      return pNVar1;
    }
  }
  else {
    do {
      parseNode(&local_90,this);
      std::vector<JSON::Node,_std::allocator<JSON::Node>_>::emplace_back<JSON::Node>
                (&local_e8,&local_90);
      std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector(&local_90.children);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.rawValue._M_dataplus._M_p != &local_90.rawValue.field_2) {
        operator_delete(local_90.rawValue._M_dataplus._M_p,
                        local_90.rawValue.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.type._M_dataplus._M_p != &local_90.type.field_2) {
        operator_delete(local_90.type._M_dataplus._M_p,
                        local_90.type.field_2._M_allocated_capacity + 1);
      }
      TVar2 = token->type;
      if (TVar2 != COMMA) goto LAB_00105c26;
      next(this);
    } while ((this->pos < this->length) && ((this->currentToken).type != BRACKETS_END));
    token = &this->lastToken;
  }
  unexpected(this,token);
}

Assistant:

Node Parser::parseArrayExpression() {
        bool hasTailComma = false;
        int startPos = currentToken.start;
        expect(BRACKETS_START);
        next();
        vector<Node> elements;

        while (isValidPos() && currentToken.type != BRACKETS_END) {
            hasTailComma = false;
            elements.push_back(parseNode());

            // end of element
            if (currentToken.type == COMMA) {
                hasTailComma = true;
                next();
            } else if (currentToken.type != BRACKETS_END) {
                break;
            }
        }

        if (hasTailComma) {
            unexpected(lastToken);
        }

        expect(BRACKETS_END);
        Node node(NodeType::ArrayExpression, elements, startPos, currentToken.end);
        next();

        return node;
    }